

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O1

int do_stackoverflow(int incallp)

{
  DLword *pDVar1;
  DLword DVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  DLword *pDVar6;
  ushort uVar7;
  StackWord SVar8;
  int iVar9;
  StackWord *pSVar10;
  DLword *pDVar11;
  DLword *pDVar12;
  StackWord *pSVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ushort *puVar17;
  undefined2 *puVar18;
  ushort *puVar19;
  StackWord *pSVar20;
  StackWord *start68k;
  uint local_58;
  
  pDVar6 = MachineState.pvar;
  if (*NeedHardreturnCleanup_word != 0) {
    warn("HardreturnCleanup in do_stackoverflow");
  }
  if (incallp == 0) {
    DVar2 = 0;
  }
  else {
    DVar2 = MachineState.pvar[-5];
  }
  MachineState.csp = MachineState.csp + 2;
  uVar16 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar16) {
    printf("Stack offset is out of range: 0x%tx\n",uVar16);
  }
  MachineState.pvar[-5] = (DLword)uVar16;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  pDVar12 = MachineState.pvar;
  start68k = (StackWord *)(MachineState.pvar + -10);
  uVar7 = MachineState.pvar[-5];
  if (((ulong)start68k & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",start68k);
  }
  uVar15 = (uint)uVar7 - ((uint)((int)start68k - (int)Lisp_world) >> 1 & 0xffff);
  local_58 = uVar15 + 2;
  puVar19 = (ushort *)((ulong)((uint)pDVar12[-5] * 2) + (long)Stackspace);
  bVar5 = false;
  bVar4 = false;
  while( true ) {
    if (puVar19[1] == 0xa000) {
      uVar16 = (ulong)*puVar19;
      puVar17 = puVar19 + uVar16;
      if (puVar17[1] == 0xa000) goto LAB_0012b5c9;
      uVar16 = (long)puVar17 - (long)Stackspace >> 1;
      if (0xffff < uVar16) {
        printf("Stack offset is out of range: 0x%tx\n",uVar16);
      }
      if (InterfacePage->endofstack == (DLword)uVar16) {
        uVar16 = (long)puVar17 - (long)Stackspace >> 1;
        if (0xffff < uVar16) {
          printf("Stack offset is out of range: 0x%tx\n",uVar16);
        }
        if ((((uint)uVar16 & 0xffff) <= (uint)(ushort)*GuardStackAddr_word) ||
           (bVar4 = true, *STACKOVERFLOW_word != 0)) {
          pDVar12 = extendstack();
          if (pDVar12 != (DLword *)0x0) goto LAB_0012b769;
          uVar16 = 0xffff;
          goto LAB_0012b790;
        }
      }
    }
    uVar14 = 0xffffffff;
    if (((*pDVar12 & 0x200000000000000) != 0) && (pDVar12[-3] == 1)) {
      if (((ulong)start68k & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",start68k);
      }
      uVar14 = (uint)((int)start68k - (int)Lisp_world) >> 1 & 3 ^ 2;
      bVar5 = true;
    }
    pSVar10 = (StackWord *)freestackblock((DLword)local_58,start68k,uVar14);
    if (pSVar10 == (StackWord *)0x0) {
      uVar16 = 0xffff;
      goto LAB_0012b790;
    }
    if (pSVar10 < Stackspace) {
      error("freestackblock returned gunk.");
    }
    if ((!bVar4) || (pSVar10 <= start68k)) break;
    pSVar10[1] = (StackWord)0xa000;
    bVar4 = true;
    if (*pSVar10 == (StackWord)0x0) {
      error("0-long stack freeblock.");
    }
  }
  if (local_58 != 0) {
    pDVar11 = pDVar12 + (long)(int)local_58 + -0xd;
    pSVar13 = pSVar10 + (int)local_58;
    uVar14 = local_58;
    do {
      pSVar13 = pSVar13 + -1;
      puVar18 = (undefined2 *)((ulong)pDVar11 ^ 2);
      pDVar11 = pDVar11 + -1;
      *(undefined2 *)((ulong)pSVar13 ^ 2) = *puVar18;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  pSVar10[1].field_0x1 = pSVar10[1].field_0x1 | 2;
  pSVar13 = pSVar10 + 2;
  uVar16 = (long)pSVar13 - (long)Stackspace >> 1;
  if (0xffff < uVar16) {
    printf("Stack offset is out of range: 0x%tx\n",uVar16);
  }
  pSVar20 = (StackWord *)(pDVar12 + -0xc);
  pSVar10[7] = (StackWord)((short)uVar16 + (short)uVar15);
  if (((ushort)*start68k & 1) == 0) {
    if (((ulong)pSVar20 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pSVar20);
    }
    SVar8 = SUB42((uint)((int)pSVar20 - (int)Lisp_world) >> 1,0);
  }
  else {
    SVar8 = *(StackWord *)(pDVar12 + -1);
  }
  pSVar10[0xb] = SVar8;
  if (((ushort)pSVar10[2] & 1) == 0) {
    pSVar10[10] = pSVar10[2];
    *(byte *)(pSVar10 + 2) = *(byte *)(pSVar10 + 2) | 1;
  }
  if (bVar5) {
    *(int *)(pSVar10 + 8) =
         *(int *)(pSVar10 + 8) + (int)((ulong)((long)pSVar13 - (long)start68k) >> 1);
  }
  if ((*pDVar12 & 0x2000000) == 0) {
    local_58 = uVar15;
    if ((int)uVar15 < 1) {
      error("creating 0 length free stack block");
    }
  }
  else {
    start68k = pSVar20;
    if ((int)uVar15 < -1) {
      error("creating 0 length free stack block");
    }
  }
  if ((uVar15 & 1) != 0) {
    error("creating odd length free stack block");
  }
  *(uint *)start68k = local_58 & 0xffff | 0xa0000000;
  start68k = pSVar13;
LAB_0012b769:
  uVar16 = (long)start68k - (long)Stackspace >> 1;
  if (0xffff < uVar16) {
    printf("Stack offset is out of range: 0x%tx\n",uVar16);
  }
LAB_0012b790:
  if ((short)uVar16 == -1) {
    MachineState.irqcheck = 0;
    MachineState.irqend = 0;
    iVar9 = 1;
  }
  else {
    uVar14 = (int)uVar16 + 10;
    uVar15 = uVar14 & 0xffff;
    if ((uVar14 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar15);
    }
    pDVar12 = Stackspace + uVar15;
    pDVar11 = Stackspace + pDVar12[-5];
    MachineState.pvar = pDVar12;
    if (*(short *)((ulong)pDVar11 ^ 2) != -0x6000) {
      error("pre_moveframe: MP9316");
    }
    sVar3 = *(short *)((ulong)pDVar11 ^ 2);
    pDVar1 = pDVar11;
    while (sVar3 == -0x6000) {
      pDVar1 = pDVar1 + *(ushort *)((ulong)(pDVar1 + 1) ^ 2);
      MachineState.endofstack = pDVar1;
      sVar3 = *(short *)((ulong)pDVar1 ^ 2);
    }
    MachineState.csp = pDVar11 + -2;
    iVar9 = 0;
    if (incallp != 0) {
      uVar16 = (ulong)((long)pDVar12 - (long)pDVar6) >> 1;
      MachineState.pvar[-5] = DVar2 + (short)uVar16;
      MachineState.ivar = MachineState.ivar + (int)uVar16;
      iVar9 = 0;
    }
  }
  return iVar9;
LAB_0012b5c9:
  do {
    uVar7 = (short)uVar16 + *puVar17;
    uVar16 = (ulong)uVar7;
    *puVar19 = uVar7;
    puVar17 = puVar17 + *puVar17;
  } while (puVar17[1] == 0xa000);
  goto LAB_0012b769;
}

Assistant:

int do_stackoverflow(int incallp) {
  DLword newfx;
  DLword savenext;
  DLword *oldPVar;
  int movedistance;
#ifdef STACKCHECK
  LispPTR stackcontents;
  LispPTR TopIVAR;

  stackcontents = *((LispPTR *)CurrentStackPTR);
  TopIVAR = *((LispPTR *)IVar);
#endif

  /* Don't care PC,FuncObj, */
  /* if incall flag ON, don't care that IVar
       became residual, and it is pointed to by copied FX's BLINK */
  oldPVar = PVar;

  if (*NeedHardreturnCleanup_word) { warn("HardreturnCleanup in do_stackoverflow"); }
  if (incallp) { savenext = CURRENTFX->nextblock; /* save old nextblock */ }

  BEFORE_CONTEXTSW; /* Don't Use MIDPUNT and Don't care IFPAGE */

  /* Call MOVEFRAME directly */
  if ((newfx = (DLword)moveframe(CURRENTFX)) == 0xFFFF) {
    /* To make immediately call HARDRESET */
    Irq_Stk_Check = 0;
    Irq_Stk_End = 0;
    return (1); /* Whole space exhausted */
  }

  /* Return from MOVEFRAME directly */

  PVar = (DLword *)NativeAligned4FromStackOffset(newfx + FRAMESIZE);
  movedistance = ((UNSIGNED)PVar - (UNSIGNED)oldPVar) >> 1;
  AFTER_CONTEXTSW;

  if (incallp) {
    /* set next(it pointed to old IVar) with offset */
    CURRENTFX->nextblock = savenext + movedistance;

/* including Last Arg(kept in TOS */
#ifdef BIGVM
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr(CURRENTFX->fnheader),
            "in call, but stack frame doesn't match FN being executed.");
#else
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr((CURRENTFX->hi2fnheader << 16) |
                                                           CURRENTFX->lofnheader),
            "in call, but stack frame doesn't match FN being executed.");
#endif /* BIGVM */
    CHECK_FX(CURRENTFX);

    /* We should re-Set up IVAR,CURRENTFX->nextblock */
    IVar += movedistance;
  } /* incallp */

  return (0); /* Normal return */
  /* If  incallp ,we CAN continue executing FN or APPLY by just returning */
  /* new PVar will set in funcall */
}